

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O3

Vec_Int_t * Lpk_ComputeBoundSets(Kit_DsdNtk_t *p,int nSizeMax)

{
  Vec_Int_t *p_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDsd.c"
                  ,0xa7,"Vec_Int_t *Lpk_ComputeBoundSets(Kit_DsdNtk_t *, int)");
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar1 = (int *)malloc(400);
  p_00->pArray = piVar1;
  Vec_IntPush(p_00,0);
  uVar2 = (uint)(p->Root >> 1);
  if (uVar2 < (uint)p->nNodes + (uint)p->nVars) {
    uVar3 = (uint)*p->pNodes[(ulong)uVar2 - (ulong)p->nVars] & 0x1c0;
    if (uVar3 != 0x40) {
      if (uVar3 == 0x80) {
        uVar3 = 1 << ((byte)((uint)p->pNodes[(ulong)uVar2 - (ulong)p->nVars][1] >> 1) & 0x1f);
        uVar2 = (uVar3 >> 1 & 0x55555555) + (uVar3 & 0x55555555);
        uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
        uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
        uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
        if ((int)((uVar2 >> 0x10) + (uVar2 & 0xffff)) <= nSizeMax) {
          Vec_IntPush(p_00,uVar3);
        }
      }
      else {
        uVar2 = Lpk_ComputeBoundSets_rec(p,(uint)p->Root,p_00,nSizeMax);
        if (0xffff < uVar2) {
          __assert_fail("(uSupport & 0xFFFF0000) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDsd.c"
                        ,0xb4,"Vec_Int_t *Lpk_ComputeBoundSets(Kit_DsdNtk_t *, int)");
        }
        uVar3 = (uVar2 >> 1 & 0x5555) + (uVar2 & 0x5555);
        uVar3 = (uVar3 >> 2 & 0x3333) + (uVar3 & 0x3333);
        uVar3 = (uVar3 >> 4 & 0x707) + (uVar3 & 0x707);
        if ((int)((uVar3 >> 8) + (uVar3 & 0xff)) <= nSizeMax) {
          Vec_IntPush(p_00,uVar2);
        }
        if (0 < p_00->nSize) {
          piVar1 = p_00->pArray;
          lVar4 = 0;
          do {
            uVar3 = piVar1[lVar4];
            piVar1[lVar4] = (~uVar3 & uVar2) << 0x10 | uVar3;
            lVar4 = lVar4 + 1;
          } while (lVar4 < p_00->nSize);
        }
      }
    }
    return p_00;
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

Vec_Int_t * Lpk_ComputeBoundSets( Kit_DsdNtk_t * p, int nSizeMax )
{
    Vec_Int_t * vSets;
    unsigned uSupport, Entry;
    int Number, i;
    assert( p->nVars <= 16 );
    vSets = Vec_IntAlloc( 100 );
    Vec_IntPush( vSets, 0 );
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
        return vSets;
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        uSupport = ( 1 << Abc_Lit2Var(Kit_DsdNtkRoot(p)->pFans[0]) );
        if ( Kit_WordCountOnes(uSupport) <= nSizeMax )
            Vec_IntPush( vSets, uSupport );
        return vSets;
    }
    uSupport = Lpk_ComputeBoundSets_rec( p, p->Root, vSets, nSizeMax );
    assert( (uSupport & 0xFFFF0000) == 0 );
    // add the total support of the network
    if ( Kit_WordCountOnes(uSupport) <= nSizeMax )
        Vec_IntPush( vSets, uSupport );
    // set the remaining variables
    Vec_IntForEachEntry( vSets, Number, i )
    {
        Entry = Number;
        Vec_IntWriteEntry( vSets, i, Entry | ((uSupport & ~Entry) << 16) );
    }
    return vSets;
}